

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterSimulationDataGenerator.cpp
# Opt level: O2

U32 __thiscall
ManchesterSimulationDataGenerator::GenerateSimulationData
          (ManchesterSimulationDataGenerator *this,U64 newest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U64 UVar1;
  ulong uVar2;
  ulong uVar3;
  U32 i;
  uint uVar4;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (newest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar2 <= uVar3) break;
    for (uVar4 = 0; uVar4 < this->mSettings->mBitsToIgnore; uVar4 = uVar4 + 1) {
      SimWriteBit(this,0);
    }
    UVar1 = this->mSimValue;
    this->mSimValue = UVar1 + 1;
    SimWriteByte(this,UVar1);
    UVar1 = this->mSimValue;
    this->mSimValue = UVar1 + 1;
    SimWriteByte(this,UVar1);
    UVar1 = this->mSimValue;
    this->mSimValue = UVar1 + 1;
    SimWriteByte(this,UVar1);
    SimulationChannelDescriptor::Advance((uint)&this->mManchesterSimulationData);
  }
  *simulation_channels = &this->mManchesterSimulationData;
  return 1;
}

Assistant:

U32 ManchesterSimulationDataGenerator::GenerateSimulationData( U64 newest_sample_requested, U32 sample_rate,
                                                               SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( newest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mManchesterSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        for( U32 i = 0; i < mSettings->mBitsToIgnore; ++i )
            SimWriteBit( 0 );
        SimWriteByte( mSimValue++ );
        SimWriteByte( mSimValue++ );
        SimWriteByte( mSimValue++ );
        mManchesterSimulationData.Advance( U32( mT * 8 ) );
    }
    *simulation_channels = &mManchesterSimulationData;
    return 1;
}